

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O3

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel
          (FloatSampleProvider *source,ResamplerStage **resamplerStages,uint stageCount)

{
  ResamplerStage *pRVar1;
  ulong uVar2;
  FloatSampleProvider *pFVar3;
  
  if (stageCount != 0) {
    uVar2 = 0;
    pFVar3 = source;
    do {
      source = (FloatSampleProvider *)operator_new(0x8028);
      pRVar1 = resamplerStages[uVar2];
      source->_vptr_FloatSampleProvider = (_func_int **)&PTR__FloatSampleProvider_00134af8;
      source[1]._vptr_FloatSampleProvider = (_func_int **)pRVar1;
      source[2]._vptr_FloatSampleProvider = (_func_int **)pFVar3;
      source[0x1003]._vptr_FloatSampleProvider = (_func_int **)(source + 3);
      *(undefined4 *)&source[0x1004]._vptr_FloatSampleProvider = 0;
      uVar2 = uVar2 + 1;
      pFVar3 = source;
    } while (stageCount != uVar2);
  }
  return source;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, ResamplerStage **resamplerStages, unsigned int stageCount) {
	FloatSampleProvider *prevStage = &source;
	for (unsigned int i = 0; i < stageCount; i++) {
		prevStage = new CascadeStage(*prevStage, *(resamplerStages[i]));
	}
	return *prevStage;
}